

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

void __thiscall MCTS::Node<NimState>::Node(Node<NimState> *this,TestGame *state)

{
  this->move = -1;
  this->parent = (Node<NimState> *)0x0;
  this->player_to_move = state->player_to_move;
  this->wins = 0.0;
  this->visits = 0;
  NimState::get_moves(&this->moves,(NimState *)state);
  (this->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->UCT_score = 0.0;
  (this->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Node<State>::Node(const State& state) :
	move(State::no_move),
	parent(nullptr),
	player_to_move(state.player_to_move),
	wins(0),
	visits(0),
	moves(state.get_moves()),
	UCT_score(0)
{ }